

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ExtractSubrange(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this,int start,int num,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **elements)

{
  Arena *pAVar1;
  Nonnull<const_char_*> failure_msg;
  Nullable<const_char_*> failure_msg_00;
  void **ppvVar2;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar3;
  int line;
  ulong uVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_48;
  LogMessage local_40;
  
  local_48 = elements;
  failure_msg = absl::lts_20250127::log_internal::Check_GEImpl(start,0,"start >= 0");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::log_internal::Check_GEImpl(num,0,"num >= 0");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      failure_msg = absl::lts_20250127::log_internal::Check_LEImpl
                              (num + start,(this->super_RepeatedPtrFieldBase).current_size_,
                               "start + num <= size()");
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        if (num != 0) {
          local_40.errno_saver_.saved_errno_ = 0;
          local_40._4_4_ = 0;
          failure_msg_00 =
               absl::lts_20250127::log_internal::
               Check_NEImpl<std::__cxx11::string**,decltype(nullptr)>
                         (&local_48,(void **)&local_40,"elements != nullptr");
          if (failure_msg_00 != (Nullable<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
                       ,0x59c,failure_msg_00);
            absl::lts_20250127::log_internal::LogMessage::operator<<
                      (&local_40,
                       (char (*) [107])
                       "Releasing elements without transferring ownership is an unsafe operation.  Use UnsafeArenaExtractSubrange."
                      );
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_40);
          }
          if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0)
          {
            pAVar1 = (this->super_RepeatedPtrFieldBase).arena_;
            ppvVar2 = internal::RepeatedPtrFieldBase::elements(&this->super_RepeatedPtrFieldBase);
            if (pAVar1 == (Arena *)0x0) {
              memcpy(local_48,ppvVar2 + start,(long)num << 3);
            }
            else {
              uVar5 = 0;
              uVar4 = 0;
              if (0 < num) {
                uVar4 = (ulong)(uint)num;
              }
              for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
                pVVar3 = internal::RepeatedPtrFieldBase::
                         copy<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                   ((Value<google::protobuf::internal::GenericTypeHandler<std::string>_>
                                     *)(ppvVar2 + start)[uVar5]);
                local_48[uVar5] = pVVar3;
              }
            }
          }
          internal::RepeatedPtrFieldBase::CloseGap(&this->super_RepeatedPtrFieldBase,start,num);
        }
        return;
      }
      line = 0x598;
    }
    else {
      line = 0x597;
    }
  }
  else {
    line = 0x596;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

inline void RepeatedPtrField<Element>::ExtractSubrange(int start, int num,
                                                       Element** elements) {
  ABSL_DCHECK_GE(start, 0);
  ABSL_DCHECK_GE(num, 0);
  ABSL_DCHECK_LE(start + num, size());

  if (num == 0) return;

  ABSL_DCHECK_NE(elements, nullptr)
      << "Releasing elements without transferring ownership is an unsafe "
         "operation.  Use UnsafeArenaExtractSubrange.";
  if (elements != nullptr) {
    Arena* arena = GetArena();
    auto* extracted = data() + start;
    if (internal::DebugHardenForceCopyInRelease()) {
      // Always copy.
      for (int i = 0; i < num; ++i) {
        elements[i] = copy<TypeHandler>(extracted[i]);
      }
      if (arena == nullptr) {
        for (int i = 0; i < num; ++i) {
          delete extracted[i];
        }
      }
    } else {
      // If we're on an arena, we perform a copy for each element so that the
      // returned elements are heap-allocated. Otherwise, just forward it.
      if (arena != nullptr) {
        for (int i = 0; i < num; ++i) {
          elements[i] = copy<TypeHandler>(extracted[i]);
        }
      } else {
        memcpy(elements, extracted, num * sizeof(Element*));
      }
    }
  }
  CloseGap(start, num);
}